

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

void gpioStopThread(pthread_t *pth)

{
  FILE *pFVar1;
  char *pcVar2;
  pthread_t pVar3;
  pthread_t *in_RDI;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: pth=%08lX\n",pcVar2,"gpioStopThread",in_RDI);
  }
  pFVar1 = _stderr;
  if ((libInitialised == 0) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,"gpioStopThread");
  }
  if (in_RDI != (pthread_t *)0x0) {
    pVar3 = pthread_self();
    if (pVar3 == *in_RDI) {
      free(in_RDI);
      pthread_exit((void *)0x0);
    }
    pthread_cancel(*in_RDI);
    pthread_join(*in_RDI,(void **)0x0);
    free(in_RDI);
  }
  return;
}

Assistant:

void gpioStopThread(pthread_t *pth)
{
   DBG(DBG_USER, "pth=%08"PRIXPTR, (uintptr_t)pth);

   CHECK_INITED_RET_NIL;

   if (pth)
   {
      if (pthread_self() == *pth)
      {
         free(pth);
         pthread_exit(NULL);
      }
      else
      {
         pthread_cancel(*pth);
         pthread_join(*pth, NULL);
         free(pth);
      }
   }
}